

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlFrustum(double left,double right,double bottom,double top,double znear,double zfar)

{
  undefined1 auVar1 [16];
  Matrix right_00;
  undefined1 auVar2 [40];
  Matrix *pMVar3;
  float fVar4;
  undefined1 auVar6 [16];
  float fVar7;
  uint uVar8;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined4 uVar14;
  float fVar15;
  undefined4 in_XMM9_Db;
  uint uStack_c4;
  undefined4 uStack_c0;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined1 auVar5 [16];
  undefined1 auVar12 [16];
  
  pMVar3 = RLGL.State.currentMatrix;
  uVar14 = (undefined4)((ulong)znear >> 0x20);
  uVar8 = (uint)((ulong)(right - left) >> 0x20);
  fVar15 = (float)(right - left);
  fVar7 = (float)znear;
  auVar9._4_4_ = uVar8;
  auVar9._0_4_ = fVar7;
  auVar9._8_4_ = in_XMM1_Dc;
  auVar9._12_4_ = in_XMM1_Dd;
  auVar10._4_12_ = auVar9._4_12_;
  auVar10._0_4_ = fVar7 + fVar7;
  auVar12._0_8_ = auVar10._0_8_;
  auVar12._8_4_ = uVar8;
  auVar12._12_4_ = (int)((ulong)left >> 0x20);
  auVar11._8_8_ = auVar12._8_8_;
  auVar11._4_4_ = (float)bottom + (float)top;
  auVar11._0_4_ = auVar10._0_4_;
  auVar1._4_4_ = (float)(top - bottom);
  auVar1._0_4_ = (float)(top - bottom);
  auVar1._8_4_ = in_XMM9_Db;
  auVar1._12_4_ = in_XMM9_Db;
  auVar13 = divps(auVar11,auVar1);
  fVar4 = fVar7 + (float)zfar;
  auVar6._0_8_ = CONCAT44(uVar8,fVar4) ^ 0x8000000080000000;
  uStack_c4 = auVar13._0_4_;
  uStack_c0 = auVar13._4_4_;
  auVar6._8_4_ = uVar8 ^ 0x80000000;
  auVar6._12_4_ = uVar8;
  auVar5._8_8_ = auVar6._8_8_;
  auVar5._0_8_ = CONCAT44(fVar7 * (float)zfar * -2.0,fVar4) ^ 0x80000000;
  auVar13._4_4_ = (float)(zfar - znear);
  auVar13._0_4_ = (float)(zfar - znear);
  auVar13._8_4_ = uVar14;
  auVar13._12_4_ = uVar14;
  auVar13 = divps(auVar5,auVar13);
  auVar2 = ZEXT2840(CONCAT424(uStack_c0,
                              CONCAT816((ulong)uStack_c4 << 0x20,
                                        CONCAT412(0,CONCAT48(((float)left + (float)right) / fVar15,
                                                             (ulong)(uint)(auVar10._0_4_ / fVar15)))
                                       )));
  right_00.m10 = (float)(int)auVar13._0_8_;
  right_00.m14 = (float)(int)((ulong)auVar13._0_8_ >> 0x20);
  right_00.m0 = (float)auVar2._0_4_;
  right_00.m4 = (float)auVar2._4_4_;
  right_00.m8 = (float)auVar2._8_4_;
  right_00.m12 = (float)auVar2._12_4_;
  right_00.m1 = (float)auVar2._16_4_;
  right_00.m5 = (float)auVar2._20_4_;
  right_00.m9 = (float)auVar2._24_4_;
  right_00.m13 = (float)auVar2._28_4_;
  right_00.m2 = (float)auVar2._32_4_;
  right_00.m6 = (float)auVar2._36_4_;
  right_00.m3 = 0.0;
  right_00.m7 = 0.0;
  right_00.m11 = -1.0;
  right_00.m15 = 0.0;
  rlMatrixMultiply(*RLGL.State.currentMatrix,right_00);
  pMVar3->m3 = (float)(undefined4)local_20;
  pMVar3->m7 = (float)local_20._4_4_;
  pMVar3->m11 = (float)(undefined4)uStack_18;
  pMVar3->m15 = (float)uStack_18._4_4_;
  pMVar3->m2 = (float)(undefined4)local_30;
  pMVar3->m6 = (float)local_30._4_4_;
  pMVar3->m10 = (float)(undefined4)uStack_28;
  pMVar3->m14 = (float)uStack_28._4_4_;
  pMVar3->m1 = (float)(undefined4)local_40;
  pMVar3->m5 = (float)local_40._4_4_;
  pMVar3->m9 = (float)(undefined4)uStack_38;
  pMVar3->m13 = (float)uStack_38._4_4_;
  pMVar3->m0 = (float)(undefined4)local_50;
  pMVar3->m4 = (float)local_50._4_4_;
  pMVar3->m8 = (float)(undefined4)uStack_48;
  pMVar3->m12 = (float)uStack_48._4_4_;
  return;
}

Assistant:

void rlFrustum(double left, double right, double bottom, double top, double znear, double zfar)
{
    Matrix matFrustum = { 0 };

    float rl = (float)(right - left);
    float tb = (float)(top - bottom);
    float fn = (float)(zfar - znear);

    matFrustum.m0 = ((float) znear*2.0f)/rl;
    matFrustum.m1 = 0.0f;
    matFrustum.m2 = 0.0f;
    matFrustum.m3 = 0.0f;

    matFrustum.m4 = 0.0f;
    matFrustum.m5 = ((float) znear*2.0f)/tb;
    matFrustum.m6 = 0.0f;
    matFrustum.m7 = 0.0f;

    matFrustum.m8 = ((float)right + (float)left)/rl;
    matFrustum.m9 = ((float)top + (float)bottom)/tb;
    matFrustum.m10 = -((float)zfar + (float)znear)/fn;
    matFrustum.m11 = -1.0f;

    matFrustum.m12 = 0.0f;
    matFrustum.m13 = 0.0f;
    matFrustum.m14 = -((float)zfar*(float)znear*2.0f)/fn;
    matFrustum.m15 = 0.0f;

    *RLGL.State.currentMatrix = rlMatrixMultiply(*RLGL.State.currentMatrix, matFrustum);
}